

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_note.cpp
# Opt level: O0

void __thiscall BmsNoteManager::AllScratch(BmsNoteManager *this,int seed,int sc,int s,int e)

{
  barindex bar_00;
  bool bVar1;
  int iVar2;
  reference piVar3;
  size_type sVar4;
  reference pvVar5;
  BmsNote local_100;
  int local_dc;
  int local_d8;
  int nc;
  int local_b4;
  int local_b0;
  int c;
  barindex local_8c;
  iterator iStack_88;
  barindex bar;
  _Self local_80;
  iterator it;
  vector<int,_std::allocator<int>_> channels;
  undefined1 local_50 [8];
  set<int,_std::less<int>,_std::allocator<int>_> notemap;
  int e_local;
  int s_local;
  int sc_local;
  int seed_local;
  BmsNoteManager *this_local;
  
  notemap._M_t._M_impl.super__Rb_tree_header._M_node_count._0_4_ = e;
  notemap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = s;
  srand(seed);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  GetNoteExistBar(this,(set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&it);
  local_80._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  while( true ) {
    iStack_88 = std::set<int,_std::less<int>,_std::allocator<int>_>::end
                          ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
    bVar1 = std::operator!=(&local_80,&stack0xffffffffffffff78);
    if (!bVar1) break;
    piVar3 = std::_Rb_tree_const_iterator<int>::operator*(&local_80);
    local_8c = *piVar3;
    BmsNoteLane::Get((BmsNote *)&stack0xffffffffffffff50,this->lanes_,local_8c);
    iVar2 = local_b0;
    BmsNote::~BmsNote((BmsNote *)&stack0xffffffffffffff50);
    if (iVar2 == 0) {
      for (local_b4 = notemap._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
          local_b4 <= (int)notemap._M_t._M_impl.super__Rb_tree_header._M_node_count;
          local_b4 = local_b4 + 1) {
        if (local_b4 != sc) {
          BmsNoteLane::Get((BmsNote *)&stack0xffffffffffffff28,this->lanes_ + local_b4,local_8c);
          iVar2 = local_d8;
          BmsNote::~BmsNote((BmsNote *)&stack0xffffffffffffff28);
          if (iVar2 == 1) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((vector<int,_std::allocator<int>_> *)&it,&local_b4);
          }
        }
      }
      iVar2 = rand();
      sVar4 = std::vector<int,_std::allocator<int>_>::size((vector<int,_std::allocator<int>_> *)&it)
      ;
      pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&it,(ulong)(long)iVar2 % sVar4);
      bar_00 = local_8c;
      local_dc = *pvVar5;
      BmsNoteLane::Get(&local_100,this->lanes_ + local_dc,local_8c);
      BmsNoteLane::Set(this->lanes_ + sc,bar_00,&local_100);
      BmsNote::~BmsNote(&local_100);
      BmsNoteLane::Delete(this->lanes_ + local_dc,local_8c);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&it);
    }
    std::_Rb_tree_const_iterator<int>::operator++(&local_80);
  }
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&it);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)local_50);
  return;
}

Assistant:

void BmsNoteManager::AllScratch(int seed, int sc, int s, int e) {
	// get a note randomly from column
	srand(seed);
	std::set<barindex> notemap;
	GetNoteExistBar(notemap);
	std::vector<int> channels;
	for (auto it = notemap.begin(); it != notemap.end(); ++it) {
		barindex bar = *it;
		// SP
		if (lanes_[0].Get(bar).type == BmsNote::NOTE_NONE) {
			// find available note list
			for (int c = s; c <= e; c++) if (c != sc) {
				switch (lanes_[c].Get(bar).type) {
				case BmsNote::NOTE_NORMAL:
					channels.push_back(c);
				}
			}
			// push scratch from available note list
			int nc = channels[rand() % channels.size()];
			lanes_[sc].Set(bar, lanes_[nc].Get(bar));
			lanes_[nc].Delete(bar);
			channels.clear();
		}
	}
}